

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wave_header.cpp
# Opt level: O0

void cinemo::wh::printWaveHeader(WaveHeader *wh)

{
  bool bVar1;
  _Setfill<char> _Var2;
  fmtflags __fmtfl;
  _Setw _Var3;
  ostream *poVar4;
  void *pvVar5;
  basic_ostream<char,_std::char_traits<char>_> *pbVar6;
  int local_18;
  int i;
  fmtflags flags;
  WaveHeader *wh_local;
  
  poVar4 = std::operator<<((ostream *)&std::cout,"-------------------------------------");
  std::ostream::operator<<(poVar4,std::endl<char,std::char_traits<char>>);
  poVar4 = std::operator<<((ostream *)&std::cout,"Wave Header Information");
  std::ostream::operator<<(poVar4,std::endl<char,std::char_traits<char>>);
  poVar4 = std::operator<<((ostream *)&std::cout,"File: \t");
  poVar4 = std::operator<<(poVar4,(string *)wh);
  std::ostream::operator<<(poVar4,std::endl<char,std::char_traits<char>>);
  poVar4 = std::operator<<((ostream *)&std::cout,"Total size: ");
  poVar4 = (ostream *)std::ostream::operator<<(poVar4,wh->FileSize);
  poVar4 = std::operator<<(poVar4," Bytes");
  std::ostream::operator<<(poVar4,std::endl<char,std::char_traits<char>>);
  poVar4 = std::operator<<((ostream *)&std::cout,"Riff Size: ");
  poVar4 = (ostream *)std::ostream::operator<<(poVar4,wh->RiffSize);
  poVar4 = std::operator<<(poVar4," Bytes");
  std::ostream::operator<<(poVar4,std::endl<char,std::char_traits<char>>);
  poVar4 = std::operator<<((ostream *)&std::cout,"Wave ID: ");
  poVar4 = std::operator<<(poVar4,(string *)&wh->WaveId);
  std::ostream::operator<<(poVar4,std::endl<char,std::char_traits<char>>);
  poVar4 = std::operator<<((ostream *)&std::cout,"Format Size: ");
  poVar4 = (ostream *)std::ostream::operator<<(poVar4,wh->FormatSize);
  poVar4 = std::operator<<(poVar4," Bytes");
  std::ostream::operator<<(poVar4,std::endl<char,std::char_traits<char>>);
  poVar4 = std::operator<<((ostream *)&std::cout,"AudioType: ");
  pvVar5 = (void *)std::ostream::operator<<(poVar4,wh->FormatAudioType);
  std::ostream::operator<<(pvVar5,std::endl<char,std::char_traits<char>>);
  poVar4 = std::operator<<((ostream *)&std::cout,"Channels: ");
  pvVar5 = (void *)std::ostream::operator<<(poVar4,wh->NumberOfChannels);
  std::ostream::operator<<(pvVar5,std::endl<char,std::char_traits<char>>);
  poVar4 = std::operator<<((ostream *)&std::cout,"Sample Rate: ");
  poVar4 = (ostream *)std::ostream::operator<<(poVar4,wh->SampleRate);
  poVar4 = std::operator<<(poVar4," Hz");
  std::ostream::operator<<(poVar4,std::endl<char,std::char_traits<char>>);
  poVar4 = std::operator<<((ostream *)&std::cout,"Byte Rate: ");
  poVar4 = (ostream *)std::ostream::operator<<(poVar4,wh->ByteRate);
  poVar4 = std::operator<<(poVar4," Bps");
  std::ostream::operator<<(poVar4,std::endl<char,std::char_traits<char>>);
  poVar4 = std::operator<<((ostream *)&std::cout,"Block Align: ");
  pvVar5 = (void *)std::ostream::operator<<(poVar4,wh->BlockAlign);
  std::ostream::operator<<(pvVar5,std::endl<char,std::char_traits<char>>);
  poVar4 = std::operator<<((ostream *)&std::cout,"Bits per Sample: \t");
  pvVar5 = (void *)std::ostream::operator<<(poVar4,wh->BitsPerSample);
  std::ostream::operator<<(pvVar5,std::endl<char,std::char_traits<char>>);
  poVar4 = std::operator<<((ostream *)&std::cout,"Extension Size: \t");
  pvVar5 = (void *)std::ostream::operator<<(poVar4,wh->ExtensionSize);
  std::ostream::operator<<(pvVar5,std::endl<char,std::char_traits<char>>);
  bVar1 = WaveHeader::isExtendedFormat(wh);
  if (bVar1) {
    poVar4 = std::operator<<((ostream *)&std::cout,"\tExt. Valid Bits Per Sample: ");
    pvVar5 = (void *)std::ostream::operator<<(poVar4,wh->ValidBitsPerSample);
    std::ostream::operator<<(pvVar5,std::endl<char,std::char_traits<char>>);
    poVar4 = std::operator<<((ostream *)&std::cout,"\tExt. Channel Mask: ");
    pvVar5 = (void *)std::ostream::operator<<(poVar4,wh->ChannelMask);
    std::ostream::operator<<(pvVar5,std::endl<char,std::char_traits<char>>);
    std::operator<<((ostream *)&std::cout,"\tGUID: ");
    __fmtfl = std::ios_base::flags((ios_base *)((long)&std::cout + *(long *)(std::cout + -0x18)));
    for (local_18 = 0; local_18 < (int)(wh->ExtensionSize - 6); local_18 = local_18 + 1) {
      poVar4 = std::operator<<((ostream *)&std::cout,"0x");
      _Var2 = std::setfill<char>('0');
      poVar4 = std::operator<<(poVar4,_Var2._M_c);
      _Var3 = std::setw(2);
      poVar4 = std::operator<<(poVar4,_Var3);
      pvVar5 = (void *)std::ostream::operator<<(poVar4,std::hex);
      poVar4 = (ostream *)std::ostream::operator<<(pvVar5,(uint)wh->SubFormat[local_18]);
      std::operator<<(poVar4," ");
    }
    std::ostream::operator<<(&std::cout,std::endl<char,std::char_traits<char>>);
    std::ios_base::flags((ios_base *)((long)&std::cout + *(long *)(std::cout + -0x18)),__fmtfl);
  }
  if ((wh->HasFact & 1U) != 0) {
    poVar4 = std::operator<<((ostream *)&std::cout,"FACT Details: ");
    std::ostream::operator<<(poVar4,std::endl<char,std::char_traits<char>>);
    poVar4 = std::operator<<((ostream *)&std::cout,"\tSize: ");
    pvVar5 = (void *)std::ostream::operator<<(poVar4,wh->FactSize);
    std::ostream::operator<<(pvVar5,std::endl<char,std::char_traits<char>>);
    poVar4 = std::operator<<((ostream *)&std::cout,"\tSample Length: ");
    poVar4 = (ostream *)std::ostream::operator<<(poVar4,wh->FactSampleLength);
    poVar4 = std::operator<<(poVar4," Bytes");
    std::ostream::operator<<(poVar4,std::endl<char,std::char_traits<char>>);
    if (4 < wh->FactSize) {
      poVar4 = std::operator<<((ostream *)&std::cout,
                               "\tNote: there is information which have been skipped!");
      std::ostream::operator<<(poVar4,std::endl<char,std::char_traits<char>>);
    }
  }
  poVar4 = std::operator<<((ostream *)&std::cout,"Data Size: ");
  poVar4 = (ostream *)std::ostream::operator<<(poVar4,wh->DataSize);
  poVar4 = std::operator<<(poVar4," Bytes");
  std::ostream::operator<<(poVar4,std::endl<char,std::char_traits<char>>);
  poVar4 = std::operator<<((ostream *)&std::cout,"Data Begins: ");
  pvVar5 = (void *)std::ostream::operator<<(poVar4,wh->DataBegin);
  std::ostream::operator<<(pvVar5,std::endl<char,std::char_traits<char>>);
  if ((wh->hasList & 1U) != 0) {
    poVar4 = std::operator<<((ostream *)&std::cout,"LIST Size: ");
    pvVar5 = (void *)std::ostream::operator<<(poVar4,wh->ListSize);
    std::ostream::operator<<(pvVar5,std::endl<char,std::char_traits<char>>);
  }
  bVar1 = std::bitset<8UL>::any(&wh->WarningFlags);
  if (bVar1) {
    poVar4 = std::operator<<((ostream *)&std::cout,"Warning Flags: ");
    pbVar6 = std::operator<<(poVar4,&wh->WarningFlags);
    std::ostream::operator<<(pbVar6,std::endl<char,std::char_traits<char>>);
  }
  bVar1 = std::bitset<8UL>::any(&wh->ErrorFlags);
  if (bVar1) {
    poVar4 = std::operator<<((ostream *)&std::cout,"Error Flags: ");
    pbVar6 = std::operator<<(poVar4,&wh->ErrorFlags);
    std::ostream::operator<<(pbVar6,std::endl<char,std::char_traits<char>>);
  }
  poVar4 = std::operator<<((ostream *)&std::cout,"-------------------------------------");
  std::ostream::operator<<(poVar4,std::endl<char,std::char_traits<char>>);
  return;
}

Assistant:

void printWaveHeader(const WaveHeader& wh) {

            cout << "-------------------------------------" << endl;
            cout << "Wave Header Information" << endl;
            cout << "File: \t" << wh.File << endl;
            cout << "Total size: " << wh.FileSize << " Bytes" << endl;
            cout << "Riff Size: " << wh.RiffSize << " Bytes" << endl;
            cout << "Wave ID: " << wh.WaveId << endl;
            cout << "Format Size: " << wh.FormatSize << " Bytes" << endl;
            cout << "AudioType: " << wh.FormatAudioType << endl;
            cout << "Channels: " << wh.NumberOfChannels << endl;
            cout << "Sample Rate: " << wh.SampleRate << " Hz" << endl;
            cout << "Byte Rate: " << wh.ByteRate << " Bps" << endl;
            cout << "Block Align: " << wh.BlockAlign << endl;
            cout << "Bits per Sample: \t" << wh.BitsPerSample << endl;
            cout << "Extension Size: \t" << wh.ExtensionSize << endl;
            if (wh.isExtendedFormat()) {
                cout << "\tExt. Valid Bits Per Sample: "
                     << wh.ValidBitsPerSample
                     << endl;
                cout << "\tExt. Channel Mask: " << wh.ChannelMask << endl;
                cout << "\tGUID: ";
                auto flags = cout.flags(); //keep current console flags
                for (int i = 0; i < wh.ExtensionSize - 6; i++) {
                    cout << "0x" << std::setfill('0') << std::setw(2)
                         << std::hex << +wh.SubFormat[i] << " ";
                }
                cout << endl;
                cout.flags(flags);
            }
            if (wh.HasFact) {
                cout << "FACT Details: " << endl;
                cout << "\tSize: " << wh.FactSize << endl;
                cout << "\tSample Length: " << wh.FactSampleLength << " Bytes"
                     << endl;
                if (wh.FactSize > 4) { //standard is 4...but there maybe more
                    cout
                            << "\tNote: there is information which have been skipped!"
                            << endl;
                }
            }
            cout << "Data Size: " << wh.DataSize << " Bytes" << endl;
            cout << "Data Begins: " << wh.DataBegin << endl;
            if (wh.hasList) {
                cout << "LIST Size: " << wh.ListSize << endl;
            }
            if (wh.WarningFlags.any()) {
                cout << "Warning Flags: " << wh.WarningFlags << endl;
            }
            if (wh.ErrorFlags.any()) {
                cout << "Error Flags: " << wh.ErrorFlags << endl;
            }
            cout << "-------------------------------------" << endl;
        }